

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# info.c
# Opt level: O2

uchar * opus_tags_get_binary_suffix(OpusTags *_tags,int *_len)

{
  int iVar1;
  int iVar2;
  
  if (_tags->comment_lengths == (int *)0x0) {
    *_len = 0;
  }
  else {
    iVar1 = _tags->comments;
    iVar2 = _tags->comment_lengths[iVar1];
    *_len = iVar2;
    if (0 < iVar2) {
      return (uchar *)_tags->user_comments[iVar1];
    }
  }
  return (uchar *)0x0;
}

Assistant:

const unsigned char *opus_tags_get_binary_suffix(const OpusTags *_tags,
 int *_len){
  int ncomments;
  int len;
  ncomments=_tags->comments;
  len=_tags->comment_lengths==NULL?0:_tags->comment_lengths[ncomments];
  *_len=len;
  OP_ASSERT(len==0||_tags->user_comments!=NULL);
  return len>0?(const unsigned char *)_tags->user_comments[ncomments]:NULL;
}